

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void do_gc(void)

{
  int64_t iVar1;
  object *poVar2;
  int64_t iVar3;
  object **ppoVar4;
  object ***pppoVar5;
  long lVar6;
  bool bVar7;
  
  iVar1 = time_usec();
  bVar7 = inSpaceOne == 0;
  memoryBase = spaceTwo;
  if (bVar7) {
    memoryBase = spaceOne;
  }
  inSpaceOne = (int)bVar7;
  oldBase = spaceOne;
  if (bVar7) {
    oldBase = spaceTwo;
  }
  memoryPointer = memoryBase + spaceSize;
  oldTop = oldBase + spaceSize;
  memoryTop = memoryPointer;
  if (0 < rootTop) {
    ppoVar4 = rootStack;
    lVar6 = 0;
    do {
      poVar2 = gc_move((mobject *)*ppoVar4);
      *ppoVar4 = poVar2;
      lVar6 = lVar6 + 1;
      ppoVar4 = ppoVar4 + 1;
    } while (lVar6 < rootTop);
  }
  if (0 < staticRootTop) {
    pppoVar5 = staticRoots;
    lVar6 = 0;
    do {
      poVar2 = gc_move((mobject *)**pppoVar5);
      **pppoVar5 = poVar2;
      lVar6 = lVar6 + 1;
      pppoVar5 = pppoVar5 + 1;
    } while (lVar6 < staticRootTop);
  }
  flushCache();
  lVar6 = (long)memoryTop - (long)memoryPointer;
  gc_total_mem_copied = gc_total_mem_copied + lVar6;
  if (gc_mem_max_copied < lVar6) {
    gc_mem_max_copied = lVar6;
  }
  iVar3 = time_usec();
  gc_count = gc_count + 1;
  lVar6 = iVar3 - iVar1;
  gc_total_time = gc_total_time + lVar6;
  if (gc_max_time < lVar6) {
    gc_max_time = lVar6;
  }
  return;
}

Assistant:

void do_gc()
{
    int i;
    int64_t start = time_usec();
    int64_t end = 0;

    /* first change spaces */
    if (inSpaceOne) {
        memoryBase = spaceTwo;
        inSpaceOne = 0;
        oldBase = spaceOne;
    } else {
        memoryBase = spaceOne;
        inSpaceOne = 1;
        oldBase = spaceTwo;
    }

    memoryPointer = memoryTop = memoryBase + spaceSize;
    oldTop = oldBase + spaceSize;

    /* then do the collection */
    for (i = 0; i < rootTop; i++) {
        rootStack[i] = gc_move((struct mobject *) rootStack[i]);
    }
    for (i = 0; i < staticRootTop; i++) {
        (* staticRoots[i]) =  gc_move((struct mobject *)
                                      *staticRoots[i]);
    }

    flushCache();

    /* FIXME - pointer comparisons are NOT portable. */
    gc_total_mem_copied += ((char *)memoryTop - (char *)memoryPointer);
    if(((char *)memoryTop - (char *)memoryPointer) > gc_mem_max_copied) {
        gc_mem_max_copied = ((char *)memoryTop - (char *)memoryPointer);
    }

    end = time_usec();

    /* calculate stats about the GC runs. */
    gc_count++;
    gc_total_time += (end - start);

    if(gc_max_time < (end - start)) {
        gc_max_time = (end - start);
    }
}